

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synch_test.c
# Opt level: O0

void test_mutex_lock_unlock(void)

{
  nng_err num;
  int iVar1;
  char *pcVar2;
  int local_18;
  int i;
  nng_err result_;
  nng_mtx *mtx;
  
  num = nng_mtx_alloc((nng_mtx **)&i);
  pcVar2 = nng_strerror(num);
  iVar1 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/synch_test.c"
                         ,0x29,"%s: expected success, got %s (%d)","nng_mtx_alloc(&mtx)",pcVar2,num)
  ;
  if (iVar1 == 0) {
    acutest_abort_();
  }
  for (local_18 = 1; local_18 < 100; local_18 = local_18 + 1) {
    nng_mtx_lock(_i);
    nng_mtx_unlock(_i);
  }
  nng_mtx_free(_i);
  return;
}

Assistant:

static void
test_mutex_lock_unlock(void)
{
	nng_mtx *mtx;
	NUTS_PASS(nng_mtx_alloc(&mtx));
	for (int i = 1; i < 100; i++) {
		nng_mtx_lock(mtx);
		nng_mtx_unlock(mtx);
	}
	nng_mtx_free(mtx);
}